

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * lua_pushstring(lua_State *L,char *s)

{
  TString *pTVar1;
  StkId pTVar2;
  TString *x_;
  
  if (s == (char *)0x0) {
    pTVar2 = L->top;
    pTVar2->tt_ = 0;
    pTVar1 = (TString *)0x0;
  }
  else {
    pTVar1 = luaS_new(L,s);
    pTVar2 = L->top;
    (pTVar2->value_).gc = (GCObject *)pTVar1;
    pTVar2->tt_ = pTVar1->tt | 0x40;
    pTVar1 = pTVar1 + 1;
    pTVar2 = L->top;
  }
  L->top = pTVar2 + 1;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  return (char *)pTVar1;
}

Assistant:

LUA_API const char *lua_pushstring (lua_State *L, const char *s) {
  lua_lock(L);
  if (s == NULL)
    setnilvalue(s2v(L->top));
  else {
    TString *ts;
    ts = luaS_new(L, s);
    setsvalue2s(L, L->top, ts);
    s = getstr(ts);  /* internal copy's address */
  }
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return s;
}